

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_ExcludesMixedFlags_Test::TestBody(TApp_ExcludesMixedFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  AssertHelper local_300;
  Message local_2f8 [2];
  ExcludesError *anon_var_0_1;
  char *pcStack_2e0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8 [32];
  iterator local_288;
  size_type local_280;
  AssertHelper local_278;
  Message local_270 [2];
  ExcludesError *anon_var_0;
  char *pcStack_258;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220 [32];
  iterator local_200;
  size_type local_1f8;
  undefined1 local_1ea;
  allocator local_1e9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  iterator local_1c0;
  size_type local_1b8;
  undefined1 local_1aa;
  allocator local_1a9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  iterator local_180;
  size_type local_178;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  Option *local_d0;
  Option *opt3;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt1;
  TApp_ExcludesMixedFlags_Test *this_local;
  
  opt1 = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--opt1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--opt2",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)((long)&opt3 + 7));
  CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt3 + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"--opt3",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_d0 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"--no",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"",&local_169);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_140,&local_168);
  CLI::Option::excludes<CLI::Option*,char_const*,CLI::Option*>(pOVar2,local_18,"--opt2",local_d0);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1aa = '\x01';
  local_1a9._1_8_ = &local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"--no",local_1a9);
  local_1aa = '\0';
  local_180 = &local_1a0;
  local_178 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_180;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180;
  do {
    local_398 = local_398 + -1;
    std::__cxx11::string::~string((string *)local_398);
  } while (local_398 != &local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1ea = '\x01';
  local_1e9._1_8_ = &local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"--opt2",local_1e9);
  local_1ea = '\0';
  local_1c0 = &local_1e0;
  local_1b8 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_1c0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0;
  do {
    local_3c0 = local_3c0 + -1;
    std::__cxx11::string::~string((string *)local_3c0);
  } while (local_3c0 != &local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)local_1e9);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"--no",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"--opt1",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_200 = &local_240;
  local_1f8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_200;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200;
  do {
    local_3f8 = local_3f8 + -1;
    std::__cxx11::string::~string((string *)local_3f8);
  } while (local_3f8 != &local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffda8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffda8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00146ff6;
    pcStack_258 = 
    "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_270);
  testing::internal::AssertHelper::AssertHelper
            (&local_278,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x415,pcStack_258);
  testing::internal::AssertHelper::operator=(&local_278,local_270);
  testing::internal::AssertHelper::~AssertHelper(&local_278);
  testing::Message::~Message(local_270);
LAB_00146ff6:
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c8,"--no",(allocator *)((long)&gtest_msg_1.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"--opt2",(allocator *)((long)&gtest_msg_1.value + 6));
  gtest_msg_1.value._5_1_ = 0;
  local_288 = &local_2c8;
  local_280 = 2;
  __l._M_len = 2;
  __l._M_array = local_288;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_4b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288;
  do {
    local_4b0 = local_4b0 + -1;
    std::__cxx11::string::~string((string *)local_4b0);
  } while (local_4b0 != &local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd20);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) {
      return;
    }
    pcStack_2e0 = 
    "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_2f8);
  testing::internal::AssertHelper::AssertHelper
            (&local_300,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x419,pcStack_2e0);
  testing::internal::AssertHelper::operator=(&local_300,local_2f8);
  testing::internal::AssertHelper::~AssertHelper(&local_300);
  testing::Message::~Message(local_2f8);
  return;
}

Assistant:

TEST_F(TApp, ExcludesMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--no")->excludes(opt1, "--opt2", opt3);

    run();

    app.reset();
    args = {"--no"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--no", "--opt1"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--no", "--opt2"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}